

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::TransformationParameter::SerializeWithCachedSizes
          (TransformationParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  uint32 value;
  int iVar3;
  char *data;
  string *value_00;
  UnknownFieldSet *unknown_fields;
  float fVar4;
  int local_40;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TransformationParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x20) != 0) {
    fVar4 = scale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar4,output);
  }
  if ((uVar1 & 4) != 0) {
    bVar2 = mirror(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar2,output);
  }
  if ((uVar1 & 2) != 0) {
    value = crop_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(3,value,output);
  }
  if ((uVar1 & 1) != 0) {
    mean_file_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,iVar3,SERIALIZE,"caffe.TransformationParameter.mean_file");
    value_00 = mean_file_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(4,value_00,output);
  }
  local_40 = 0;
  iVar3 = mean_value_size(this);
  for (; local_40 < iVar3; local_40 = local_40 + 1) {
    fVar4 = mean_value(this,local_40);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar4,output);
  }
  if ((uVar1 & 8) != 0) {
    bVar2 = force_color(this);
    google::protobuf::internal::WireFormatLite::WriteBool(6,bVar2,output);
  }
  if ((uVar1 & 0x10) != 0) {
    bVar2 = force_gray(this);
    google::protobuf::internal::WireFormatLite::WriteBool(7,bVar2,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = TransformationParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void TransformationParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.TransformationParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float scale = 1 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->scale(), output);
  }

  // optional bool mirror = 2 [default = false];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->mirror(), output);
  }

  // optional uint32 crop_size = 3 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(3, this->crop_size(), output);
  }

  // optional string mean_file = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.TransformationParameter.mean_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->mean_file(), output);
  }

  // repeated float mean_value = 5;
  for (int i = 0, n = this->mean_value_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      5, this->mean_value(i), output);
  }

  // optional bool force_color = 6 [default = false];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->force_color(), output);
  }

  // optional bool force_gray = 7 [default = false];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(7, this->force_gray(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.TransformationParameter)
}